

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::get_coboundary_of_a_cell
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Bitmap_cubical_complex_base<double> *this,size_t cell)

{
  pointer puVar1;
  iterator iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> counter;
  unsigned_long local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  compute_counter_for_given_cell(&local_48,this,cell);
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (long)(this->multipliers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->multipliers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2;
  sVar5 = cell;
  if (1 < uVar6) {
    do {
      puVar1 = (this->multipliers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = CONCAT44(0,puVar1[uVar6 - 1]);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar7;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar5;
      sVar5 = sVar5 % uVar7;
      uVar6 = uVar6 - 1;
      if ((auVar4 / auVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        if ((uVar7 < cell) &&
           (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] != 0)) {
          local_50 = cell - puVar1[uVar6];
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(__return_storage_ptr__,iVar2,&local_50);
          }
          else {
            *iVar2._M_current = local_50;
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        }
        puVar1 = (this->multipliers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((puVar1[uVar6] + cell <
             (ulong)((long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3)) &&
           (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] !=
            (this->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar6] * 2)) {
          local_50 = puVar1[uVar6] + cell;
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(__return_storage_ptr__,iVar2,&local_50);
          }
          else {
            *iVar2._M_current = local_50;
            (__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        }
      }
    } while (1 < uVar6);
  }
  if ((sVar5 & 1) == 0) {
    if ((1 < cell) &&
       (*local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start != 0)) {
      local_50 = cell - 1;
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (__return_storage_ptr__,iVar2,&local_50);
      }
      else {
        *iVar2._M_current = local_50;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
    uVar6 = cell + 1;
    if ((uVar6 < (ulong)((long)(this->data).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->data).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3)) &&
       (*local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start !=
        *(this->sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start * 2)) {
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      local_50 = uVar6;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (__return_storage_ptr__,iVar2,&local_50);
      }
      else {
        *iVar2._M_current = uVar6;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
    }
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::size_t> Bitmap_cubical_complex_base<T>::get_coboundary_of_a_cell(std::size_t cell) const {
  std::vector<unsigned> counter = this->compute_counter_for_given_cell(cell);
  std::vector<std::size_t> coboundary_elements;
  std::size_t cell1 = cell;
  for (std::size_t i = this->multipliers.size(); i > 1; --i) {
    // It is a bit sad to recompute those divisions when we just did them in compute_counter_for_given_cell.
    unsigned position = cell1 / this->multipliers[i - 1];
    cell1 = cell1 % this->multipliers[i - 1];
    if (position % 2 == 0) {
      if ((cell > this->multipliers[i - 1]) && (counter[i - 1] != 0)) {
        coboundary_elements.push_back(cell - this->multipliers[i - 1]);
      }
      if ((cell + this->multipliers[i - 1] < this->data.size()) && (counter[i - 1] != 2 * this->sizes[i - 1])) {
        coboundary_elements.push_back(cell + this->multipliers[i - 1]);
      }
    }
  }
  if (cell1 % 2 == 0) {
    if ((cell > 1) && (counter[0] != 0)) {
      coboundary_elements.push_back(cell - 1);
    }
    if ((cell + 1 < this->data.size()) && (counter[0] != 2 * this->sizes[0])) {
      coboundary_elements.push_back(cell + 1);
    }
  }
  return coboundary_elements;
}